

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

bool __thiscall
NumberTemp::IsTempIndirTransferLoad(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  Opnd *this_00;
  RegOpnd *pRVar1;
  code *pcVar2;
  bool bVar3;
  IndirOpnd *pIVar4;
  undefined4 *puVar5;
  Opnd *src1Opnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  bVar3 = DoMarkTempNumbersOnTempObjects(this,backwardPass);
  if (bVar3) {
    this_00 = instr->m_src1;
    if (instr->m_opcode == LdElemI_A) {
      pIVar4 = IR::Opnd::AsIndirOpnd(this_00);
      pRVar1 = pIVar4->m_indexOpnd;
      if (pRVar1 != (RegOpnd *)0x0) {
        if ((pRVar1->m_sym->field_0x18 & 2) == 0) {
          local_1a = (pRVar1->super_Opnd).m_valueType.field_0;
          bVar3 = ValueType::IsInt((ValueType *)&local_1a.field_0);
          if (bVar3) {
            return false;
          }
        }
        return (bool)((this_00->field_0xb & 0x10) >> 4);
      }
    }
    else if (((this_00 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsSymOpnd(this_00), !bVar3)) &&
            ((instr->m_src1->field_0xb & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x2fd,
                         "(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp())"
                         ,
                         "instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->CanStoreTemp()"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempIndirTransferLoad(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        if (instr->m_opcode == Js::OpCode::LdElemI_A)
        {
            // If the index is an int, then we don't care about the non-temp use
            IR::Opnd * src1Opnd = instr->GetSrc1();
            IR::RegOpnd * indexOpnd = src1Opnd->AsIndirOpnd()->GetIndexOpnd();
            if (indexOpnd && (indexOpnd->m_sym->m_isNotNumber || !indexOpnd->GetValueType().IsInt()))
            {
                return src1Opnd->CanStoreTemp();
            }
        }
        else
        {
            // All other opcode shouldn't have sym opnd that can store temp, See ObjectTemp::IsTempUseOpCodeSym.
            Assert(instr->GetSrc1() == nullptr || instr->GetSrc1()->IsSymOpnd()
                || !instr->GetSrc1()->CanStoreTemp());
        }
    }
    return false;
}